

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalNinjaGenerator::WriteDyndepFile
          (cmGlobalNinjaGenerator *this,string *dir_top_src,string *dir_top_bld,string *dir_cur_src,
          string *dir_cur_bld,string *arg_dd,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_ddis,string *module_dir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *linked_target_dirs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *forward_modules_from_target_dirs,string *arg_lang,string *arg_modmapfmt,
          cmCxxModuleExportInfo *export_info)

{
  undefined8 uVar1;
  bool bVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  cmake *this_00;
  pointer pcVar5;
  pointer this_01;
  reference pVVar6;
  mapped_type *this_02;
  pointer pVVar7;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  *__return_storage_ptr__;
  ulong uVar8;
  reference pcVar9;
  string *psVar10;
  reference pvVar11;
  mapped_type *pmVar12;
  pointer ppVar13;
  CxxModuleMapFormat *pCVar14;
  Value *pVVar15;
  ptrdiff_t *this_03;
  reference value;
  size_t *psVar16;
  char *pcVar17;
  Value *pVVar18;
  value_type *__x;
  const_iterator cVar19;
  static_string_view sVar20;
  string_view sVar21;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
  local_1be8;
  undefined1 local_1bb8 [8];
  cmDyndepMetadataCallbacks cb;
  cmGeneratedFileStream tmf;
  Value *tmi_target_modules;
  undefined1 local_1920 [7];
  anon_class_1_0_00000001 forward_info;
  string local_1900;
  undefined1 local_18e0 [8];
  Reader reader_1;
  undefined1 local_17b0 [8];
  ifstream fmftf;
  undefined1 local_15a8 [8];
  Value fmft;
  undefined1 local_1578 [8];
  string fmftn;
  string *forward_modules_from_target_dir;
  const_iterator __end1_6;
  const_iterator __begin1_6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_6;
  string local_1530;
  undefined1 local_1510 [8];
  string target_mods_file;
  string_view local_14e8;
  String local_14d8;
  Value local_14b8;
  Value local_1490;
  Value local_1468;
  Value *local_1440;
  Value *mod_ref;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>
  *r_1;
  iterator __end1_5;
  iterator __begin1_5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
  *__range1_5;
  Value *local_13f0;
  Value *target_references;
  undefined1 local_13e0 [7];
  anon_class_1_0_00000001 name_for_method;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  iterator __end2_3;
  iterator __begin2_3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_3;
  Value *local_1370;
  Value *mod_usage;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *u;
  iterator __end1_4;
  iterator __begin1_4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *__range1_4;
  Value *local_1320;
  Value *target_usages;
  Value target_module_info;
  undefined1 local_12d0 [8];
  cmGeneratedFileStream mmf;
  string mm;
  _Self local_1038;
  _Self local_1030;
  iterator mit;
  cmSourceReqInfo *r;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *__range2_2;
  string implicitOut;
  cmSourceReqInfo *p_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *__range2_1;
  cmScanDepInfo *object_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *__range1_3;
  string local_fa0;
  undefined1 local_f80 [8];
  cmNinjaBuild build;
  string local_e30;
  string local_e10;
  undefined1 local_df0 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cycle_modules;
  anon_class_8_1_9338819a aStack_db8;
  bool private_usage_found;
  anon_class_8_1_8991fb9c local_db0;
  undefined1 local_da8 [8];
  CxxModuleLocations locs;
  cmGeneratedFileStream ddf;
  Value local_ab8;
  Value local_a90;
  Value *local_a68;
  Value *module_info;
  bool local_a40;
  string local_a38;
  undefined1 local_a18 [8];
  string safe_logical_name;
  undefined1 local_9d8 [8];
  string mod;
  cmSourceReqInfo *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *__range2;
  cmScanDepInfo *object;
  iterator __end1_2;
  iterator __begin1_2;
  vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *__range1_2;
  Value target_modules;
  undefined1 local_948 [8];
  static_string_view module_ext;
  CxxModuleMapFormat local_914;
  _Optional_payload_base<CxxModuleMapFormat> local_910;
  CxxModuleMapFormat local_908;
  _Optional_payload_base<CxxModuleMapFormat> local_904;
  CxxModuleMapFormat local_8fc;
  _Optional_payload_base<CxxModuleMapFormat> local_8f8;
  _Optional_payload_base<CxxModuleMapFormat> local_8f0;
  optional<CxxModuleMapFormat> modmap_fmt;
  undefined1 local_8d8 [72];
  String local_890;
  _Base_ptr local_870;
  undefined1 local_868;
  SelfType local_860;
  _Base_ptr local_850;
  undefined1 local_848;
  undefined1 local_840 [8];
  const_iterator j;
  SelfType local_820;
  _Base_ptr local_810;
  undefined1 local_808;
  undefined1 local_800 [8];
  const_iterator i_2;
  Value *target_modules_usage;
  String local_7c0;
  undefined1 local_7a0 [8];
  string reference;
  Value *reference_method;
  undefined1 local_758 [8];
  CxxModuleReference module_reference;
  Value *reference_path;
  SelfType local_718;
  _Base_ptr local_708;
  undefined1 local_700;
  undefined1 local_6f8 [8];
  const_iterator i_1;
  Value *target_modules_references;
  String local_6b8;
  AvailableModuleInfo local_698;
  Value *local_670;
  Value *is_private;
  Value *bmi_path;
  Value *visible_module;
  undefined1 local_650;
  SelfType local_648;
  _Base_ptr local_638;
  undefined1 local_630;
  undefined1 local_628 [8];
  const_iterator i;
  Value *target_modules_1;
  string local_5f0;
  undefined1 local_5d0 [8];
  Reader reader;
  undefined1 local_4a0 [8];
  ifstream ltmf;
  undefined1 local_298 [8];
  Value ltm;
  undefined1 local_268 [8];
  string ltmn;
  string *linked_target_dir;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
  mod_files;
  CxxModuleUsage usages;
  string local_190;
  undefined1 local_170 [8];
  cmScanDepInfo info;
  string *arg_ddi;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> objects;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> local_c0;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> lgd;
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> local_b0;
  __single_object mfd;
  cmStateDirectory local_80;
  undefined1 local_58 [8];
  cmStateSnapshot snapshot;
  string *arg_dd_local;
  string *dir_cur_bld_local;
  string *dir_cur_src_local;
  string *dir_top_bld_local;
  string *dir_top_src_local;
  cmGlobalNinjaGenerator *this_local;
  
  snapshot.Position.Position = (PositionType)arg_dd;
  this_00 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)local_58,this_00);
  cmStateSnapshot::GetDirectory(&local_80,(cmStateSnapshot *)local_58);
  cmStateDirectory::SetCurrentSource(&local_80,dir_cur_src);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&mfd,(cmStateSnapshot *)local_58);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&mfd,dir_cur_bld);
  lgd._M_t.super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
  super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
  super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmLocalGenerator,_std::default_delete<cmLocalGenerator>,_true,_true>)
       (__uniq_ptr_data<cmLocalGenerator,_std::default_delete<cmLocalGenerator>,_true,_true>)this;
  std::make_unique<cmMakefile,cmGlobalNinjaGenerator*,cmStateSnapshot&>
            ((cmGlobalNinjaGenerator **)&local_b0,(cmStateSnapshot *)&lgd);
  pcVar5 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::get(&local_b0);
  (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[2])
            (&local_c0,this,pcVar5);
  this_01 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                      (&local_c0);
  cmOutputConverter::SetRelativePathTop(&this_01->super_cmOutputConverter,dir_top_src,dir_top_bld);
  std::
  vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
  ::push_back(&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles,&local_b0);
  std::
  vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
  ::push_back(&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators,
              &local_c0);
  std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::~unique_ptr(&local_c0);
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr(&local_b0);
  std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>::vector
            ((vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(arg_ddis);
  arg_ddi = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(arg_ddis);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&arg_ddi), bVar2) {
    info.Requires.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
    cmScanDepInfo::cmScanDepInfo((cmScanDepInfo *)local_170);
    bVar2 = cmScanDepFormat_P1689_Parse
                      (&(info.Requires.
                         super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage)->LogicalName,
                       (cmScanDepInfo *)local_170);
    if (bVar2) {
      std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>::push_back
                ((vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *)&__range1,
                 (value_type *)local_170);
    }
    else {
      cmStrCat<char_const(&)[48],std::__cxx11::string_const&>
                (&local_190,(char (*) [48])"-E cmake_ninja_dyndep failed to parse ddi file ",
                 &(info.Requires.
                   super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage)->LogicalName);
      cmSystemTools::Error(&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      this_local._7_1_ = 0;
    }
    usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
    usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ = !bVar2;
    cmScanDepInfo::~cmScanDepInfo((cmScanDepInfo *)local_170);
    if (usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 0)
    goto LAB_00577526;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  CxxModuleUsage::CxxModuleUsage
            ((CxxModuleUsage *)&mod_files._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
         *)&__range1_1);
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(linked_target_dirs);
  linked_target_dir =
       (string *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(linked_target_dirs);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&linked_target_dir), bVar2) {
    ltmn.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1_1);
    ltm.limit_._7_1_ = 0x2f;
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char_const(&)[13]>
              ((string *)local_268,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ltmn.field_2._8_8_,(char *)((long)&ltm.limit_ + 7),arg_lang,
               (char (*) [13])"Modules.json");
    Json::Value::Value((Value *)local_298,nullValue);
    pcVar17 = (char *)std::__cxx11::string::c_str();
    _Var4 = std::operator|(_S_in,_S_bin);
    std::ifstream::ifstream(local_4a0,pcVar17,_Var4);
    bVar3 = std::ios::operator!((ios *)(local_4a0 + (long)*(_func_int **)((long)local_4a0 + -0x18)))
    ;
    if ((bVar3 & 1) == 0) {
      Json::Reader::Reader((Reader *)local_5d0);
      bVar2 = Json::Reader::parse((Reader *)local_5d0,(istream *)local_4a0,(Value *)local_298,false)
      ;
      uVar1 = ltmn.field_2._8_8_;
      if (bVar2) {
        bVar2 = Json::Value::isObject((Value *)local_298);
        if (bVar2) {
          i.super_ValueIteratorBase._8_8_ = Json::Value::operator[]((Value *)local_298,"modules");
          bVar2 = Json::Value::isObject((Value *)i.super_ValueIteratorBase._8_8_);
          if (bVar2) {
            cVar19 = Json::Value::begin((Value *)i.super_ValueIteratorBase._8_8_);
            local_638 = (_Base_ptr)cVar19.super_ValueIteratorBase.current_._M_node;
            local_630 = cVar19.super_ValueIteratorBase.isNull_;
            local_628 = (undefined1  [8])local_638;
            i.super_ValueIteratorBase.current_._M_node._0_1_ = local_630;
            while( true ) {
              cVar19 = Json::Value::end((Value *)i.super_ValueIteratorBase._8_8_);
              visible_module = (Value *)cVar19.super_ValueIteratorBase.current_._M_node;
              local_650 = cVar19.super_ValueIteratorBase.isNull_;
              local_648.current_._M_node = (_Base_ptr)visible_module;
              local_648.isNull_ = (bool)local_650;
              bVar2 = Json::ValueIteratorBase::operator!=((ValueIteratorBase *)local_628,&local_648)
              ;
              if (!bVar2) break;
              bmi_path = Json::ValueConstIterator::operator*((ValueConstIterator *)local_628);
              bVar2 = Json::Value::isObject(bmi_path);
              if (bVar2) {
                is_private = Json::Value::operator[](bmi_path,"bmi");
                local_670 = Json::Value::operator[](bmi_path,"is-private");
                Json::Value::asString_abi_cxx11_(&local_698.BmiPath,is_private);
                local_698.IsPrivate = Json::Value::asBool(local_670);
                Json::ValueIteratorBase::key
                          ((Value *)&target_modules_references,(ValueIteratorBase *)local_628);
                Json::Value::asString_abi_cxx11_(&local_6b8,(Value *)&target_modules_references);
                pmVar12 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                                        *)&__range1_1,&local_6b8);
                WriteDyndepFile::AvailableModuleInfo::operator=(pmVar12,&local_698);
                std::__cxx11::string::~string((string *)&local_6b8);
                Json::Value::~Value((Value *)&target_modules_references);
                WriteDyndepFile::AvailableModuleInfo::~AvailableModuleInfo(&local_698);
              }
              Json::ValueConstIterator::operator++((ValueConstIterator *)local_628);
            }
          }
          i_1.super_ValueIteratorBase._8_8_ =
               Json::Value::operator[]((Value *)local_298,"references");
          bVar2 = Json::Value::isObject((Value *)i_1.super_ValueIteratorBase._8_8_);
          if (bVar2) {
            cVar19 = Json::Value::begin((Value *)i_1.super_ValueIteratorBase._8_8_);
            local_708 = (_Base_ptr)cVar19.super_ValueIteratorBase.current_._M_node;
            local_700 = cVar19.super_ValueIteratorBase.isNull_;
            local_6f8 = (undefined1  [8])local_708;
            i_1.super_ValueIteratorBase.current_._M_node._0_1_ = local_700;
            while( true ) {
              cVar19 = Json::Value::end((Value *)i_1.super_ValueIteratorBase._8_8_);
              local_718.current_ = cVar19.super_ValueIteratorBase.current_._M_node;
              local_718.isNull_ = cVar19.super_ValueIteratorBase.isNull_;
              bVar2 = Json::ValueIteratorBase::operator!=((ValueIteratorBase *)local_6f8,&local_718)
              ;
              if (!bVar2) break;
              pVVar7 = Json::ValueConstIterator::operator->((ValueConstIterator *)local_6f8);
              bVar2 = Json::Value::isObject(pVVar7);
              if (bVar2) {
                pVVar6 = Json::ValueConstIterator::operator*((ValueConstIterator *)local_6f8);
                module_reference._32_8_ = Json::Value::operator[](pVVar6,"path");
                CxxModuleReference::CxxModuleReference((CxxModuleReference *)local_758);
                bVar2 = Json::Value::isString((Value *)module_reference._32_8_);
                if (bVar2) {
                  Json::Value::asString_abi_cxx11_
                            ((String *)&reference_method,(Value *)module_reference._32_8_);
                  std::__cxx11::string::operator=((string *)local_758,(string *)&reference_method);
                  std::__cxx11::string::~string((string *)&reference_method);
                }
                pVVar6 = Json::ValueConstIterator::operator*((ValueConstIterator *)local_6f8);
                reference.field_2._8_8_ = Json::Value::operator[](pVVar6,"lookup-method");
                bVar2 = Json::Value::isString((Value *)reference.field_2._8_8_);
                if (bVar2) {
                  Json::Value::asString_abi_cxx11_
                            ((String *)local_7a0,(Value *)reference.field_2._8_8_);
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_7a0,"by-name");
                  if (bVar2) {
                    module_reference.Path.field_2._8_4_ = 0;
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_7a0,"include-angle");
                    if (bVar2) {
                      module_reference.Path.field_2._8_4_ = 1;
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_7a0,"include-quote");
                      if (bVar2) {
                        module_reference.Path.field_2._8_4_ = 2;
                      }
                    }
                  }
                  std::__cxx11::string::~string((string *)local_7a0);
                }
                Json::ValueIteratorBase::key
                          ((Value *)&target_modules_usage,(ValueIteratorBase *)local_6f8);
                Json::Value::asString_abi_cxx11_(&local_7c0,(Value *)&target_modules_usage);
                this_02 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
                                        *)&usages.Usage._M_t._M_impl.super__Rb_tree_header.
                                           _M_node_count,&local_7c0);
                CxxModuleReference::operator=(this_02,(CxxModuleReference *)local_758);
                std::__cxx11::string::~string((string *)&local_7c0);
                Json::Value::~Value((Value *)&target_modules_usage);
                CxxModuleReference::~CxxModuleReference((CxxModuleReference *)local_758);
              }
              Json::ValueConstIterator::operator++((ValueConstIterator *)local_6f8);
            }
          }
          i_2.super_ValueIteratorBase._8_8_ = Json::Value::operator[]((Value *)local_298,"usages");
          bVar2 = Json::Value::isObject((Value *)i_2.super_ValueIteratorBase._8_8_);
          if (bVar2) {
            cVar19 = Json::Value::begin((Value *)i_2.super_ValueIteratorBase._8_8_);
            local_810 = (_Base_ptr)cVar19.super_ValueIteratorBase.current_._M_node;
            local_808 = cVar19.super_ValueIteratorBase.isNull_;
            local_800 = (undefined1  [8])local_810;
            i_2.super_ValueIteratorBase.current_._M_node._0_1_ = local_808;
            while( true ) {
              cVar19 = Json::Value::end((Value *)i_2.super_ValueIteratorBase._8_8_);
              j.super_ValueIteratorBase._8_8_ = cVar19.super_ValueIteratorBase.current_._M_node;
              local_820.isNull_ = cVar19.super_ValueIteratorBase.isNull_;
              local_820.current_._M_node = (_Base_ptr)j.super_ValueIteratorBase._8_8_;
              bVar2 = Json::ValueIteratorBase::operator!=((ValueIteratorBase *)local_800,&local_820)
              ;
              if (!bVar2) break;
              pVVar7 = Json::ValueConstIterator::operator->((ValueConstIterator *)local_800);
              bVar2 = Json::Value::isArray(pVVar7);
              if (bVar2) {
                pVVar7 = Json::ValueConstIterator::operator->((ValueConstIterator *)local_800);
                cVar19 = Json::Value::begin(pVVar7);
                local_850 = (_Base_ptr)cVar19.super_ValueIteratorBase.current_._M_node;
                local_848 = cVar19.super_ValueIteratorBase.isNull_;
                local_840 = (undefined1  [8])local_850;
                j.super_ValueIteratorBase.current_._M_node._0_1_ = local_848;
                while( true ) {
                  pVVar7 = Json::ValueConstIterator::operator->((ValueConstIterator *)local_800);
                  cVar19 = Json::Value::end(pVVar7);
                  local_870 = (_Base_ptr)cVar19.super_ValueIteratorBase.current_._M_node;
                  local_868 = cVar19.super_ValueIteratorBase.isNull_;
                  local_860.current_._M_node = local_870;
                  local_860.isNull_ = (bool)local_868;
                  bVar2 = Json::ValueIteratorBase::operator!=
                                    ((ValueIteratorBase *)local_840,&local_860);
                  if (!bVar2) break;
                  Json::ValueIteratorBase::key
                            ((Value *)(local_8d8 + 0x20),(ValueIteratorBase *)local_800);
                  Json::Value::asString_abi_cxx11_(&local_890,(Value *)(local_8d8 + 0x20));
                  __return_storage_ptr__ =
                       (pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                        *)std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                        *)&mod_files._M_t._M_impl.super__Rb_tree_header.
                                           _M_node_count,&local_890);
                  pVVar7 = Json::ValueConstIterator::operator->((ValueConstIterator *)local_840);
                  Json::Value::asString_abi_cxx11_((String *)local_8d8,pVVar7);
                  modmap_fmt.super__Optional_base<CxxModuleMapFormat,_true,_true>._M_payload.
                  super__Optional_payload_base<CxxModuleMapFormat> =
                       (_Optional_base<CxxModuleMapFormat,_true,_true>)
                       std::
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::insert(__return_storage_ptr__,
                                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_8d8,__x);
                  std::__cxx11::string::~string((string *)local_8d8);
                  std::__cxx11::string::~string((string *)&local_890);
                  Json::Value::~Value((Value *)(local_8d8 + 0x20));
                  Json::ValueConstIterator::operator++((ValueConstIterator *)local_840);
                }
              }
              Json::ValueConstIterator::operator++((ValueConstIterator *)local_800);
            }
          }
        }
        usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      }
      else {
        Json::Reader::getFormattedErrorMessages_abi_cxx11_
                  ((String *)&target_modules_1,(Reader *)local_5d0);
        cmStrCat<char_const(&)[39],std::__cxx11::string_const&,std::__cxx11::string>
                  (&local_5f0,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &target_modules_1);
        cmSystemTools::Error(&local_5f0);
        std::__cxx11::string::~string((string *)&local_5f0);
        std::__cxx11::string::~string((string *)&target_modules_1);
        this_local._7_1_ = 0;
        usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
      }
      Json::Reader::~Reader((Reader *)local_5d0);
    }
    else {
      cmStrCat<char_const(&)[38],std::__cxx11::string_const&,char_const(&)[24]>
                ((string *)&reader.features_,(char (*) [38])"-E cmake_ninja_dyndep failed to open ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                 (char (*) [24])" for module information");
      cmSystemTools::Error((string *)&reader.features_);
      std::__cxx11::string::~string((string *)&reader.features_);
      this_local._7_1_ = 0;
      usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
    }
    std::ifstream::~ifstream(local_4a0);
    Json::Value::~Value((Value *)local_298);
    std::__cxx11::string::~string((string *)local_268);
    if (usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 0)
    goto LAB_005774f2;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::optional<CxxModuleMapFormat>::optional((optional<CxxModuleMapFormat> *)&local_8f0);
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    bVar2 = std::operator==(arg_modmapfmt,"clang");
    if (bVar2) {
      local_8fc = Clang;
      std::optional<CxxModuleMapFormat>::optional<CxxModuleMapFormat,_true>
                ((optional<CxxModuleMapFormat> *)&local_8f8,&local_8fc);
      local_8f0 = local_8f8;
    }
    else {
      bVar2 = std::operator==(arg_modmapfmt,"gcc");
      if (bVar2) {
        local_908 = Gcc;
        std::optional<CxxModuleMapFormat>::optional<CxxModuleMapFormat,_true>
                  ((optional<CxxModuleMapFormat> *)&local_904,&local_908);
        local_8f0 = local_904;
      }
      else {
        bVar2 = std::operator==(arg_modmapfmt,"msvc");
        if (!bVar2) {
          cmStrCat<char_const(&)[47],std::__cxx11::string_const&,char_const(&)[19]>
                    ((string *)&module_ext.super_string_view._M_str,
                     (char (*) [47])"-E cmake_ninja_dyndep does not understand the ",arg_modmapfmt,
                     (char (*) [19])" module map format");
          cmSystemTools::Error((string *)&module_ext.super_string_view._M_str);
          std::__cxx11::string::~string((string *)&module_ext.super_string_view._M_str);
          this_local._7_1_ = 0;
          usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
          goto LAB_005774f2;
        }
        local_914 = Msvc;
        std::optional<CxxModuleMapFormat>::optional<CxxModuleMapFormat,_true>
                  ((optional<CxxModuleMapFormat> *)&local_910,&local_914);
        local_8f0 = local_910;
      }
    }
  }
  target_modules.limit_._0_4_ = local_8f0._M_payload;
  target_modules.limit_._4_1_ = local_8f0._M_engaged;
  target_modules.limit_._5_3_ = local_8f0._5_3_;
  sVar20 = CxxModuleMapExtension((optional<CxxModuleMapFormat>)local_8f0);
  module_ext.super_string_view._M_len = (size_t)sVar20.super_string_view._M_str;
  local_948 = (undefined1  [8])sVar20.super_string_view._M_len;
  Json::Value::Value((Value *)&__range1_2,objectValue);
  __end1_2 = std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>::begin
                       ((vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *)&__range1);
  object = (cmScanDepInfo *)
           std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>::end
                     ((vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *)&__range1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<cmScanDepInfo_*,_std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>_>
                             *)&object), bVar2) {
    pcVar9 = __gnu_cxx::
             __normal_iterator<cmScanDepInfo_*,_std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>_>
             ::operator*(&__end1_2);
    __end2 = std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::begin
                       (&pcVar9->Provides);
    p = (cmSourceReqInfo *)
        std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::end(&pcVar9->Provides);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
                                       *)&p), bVar2) {
      mod.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
           ::operator*(&__end2);
      std::__cxx11::string::string((string *)local_9d8);
      bVar2 = cmDyndepCollation::IsBmiOnly(export_info,&pcVar9->PrimaryOutput);
      if (bVar2) {
        std::__cxx11::string::operator=((string *)local_9d8,(string *)pcVar9);
      }
      else {
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          std::__cxx11::string::operator=((string *)local_9d8,(string *)(mod.field_2._8_8_ + 0x40));
          bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_9d8);
          if (!bVar2) {
            cmsys::SystemTools::CollapseFullPath
                      ((string *)((long)&safe_logical_name.field_2 + 8),(string *)local_9d8,
                       dir_top_bld);
            std::__cxx11::string::operator=
                      ((string *)local_9d8,(string *)(safe_logical_name.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(safe_logical_name.field_2._M_local_buf + 8));
          }
        }
        else {
          std::__cxx11::string::string((string *)local_a18,(string *)mod.field_2._8_8_);
          cmsys::SystemTools::ReplaceString((string *)local_a18,":","-");
          cmStrCat<std::__cxx11::string_const&,std::__cxx11::string&,cm::static_string_view&>
                    (&local_a38,module_dir,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a18,
                     (static_string_view *)local_948);
          std::__cxx11::string::operator=((string *)local_9d8,(string *)&local_a38);
          std::__cxx11::string::~string((string *)&local_a38);
          std::__cxx11::string::~string((string *)local_a18);
        }
      }
      std::__cxx11::string::string((string *)&module_info,(string *)local_9d8);
      local_a40 = false;
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                              *)&__range1_1,(key_type *)mod.field_2._8_8_);
      WriteDyndepFile::AvailableModuleInfo::operator=(pmVar12,(AvailableModuleInfo *)&module_info);
      WriteDyndepFile::AvailableModuleInfo::~AvailableModuleInfo
                ((AvailableModuleInfo *)&module_info);
      Json::Value::Value(&local_a90,objectValue);
      pVVar15 = Json::Value::operator[]((Value *)&__range1_2,(String *)mod.field_2._8_8_);
      pVVar15 = Json::Value::operator=(pVVar15,&local_a90);
      Json::Value::~Value(&local_a90);
      local_a68 = pVVar15;
      Json::Value::Value(&local_ab8,(String *)local_9d8);
      pVVar15 = Json::Value::operator[](local_a68,"bmi");
      Json::Value::operator=(pVVar15,&local_ab8);
      Json::Value::~Value(&local_ab8);
      bVar2 = cmDyndepCollation::IsObjectPrivate(&pcVar9->PrimaryOutput,export_info);
      Json::Value::Value((Value *)&ddf.field_0x260,bVar2);
      pVVar15 = Json::Value::operator[](local_a68,"is-private");
      Json::Value::operator=(pVVar15,(Value *)&ddf.field_0x260);
      Json::Value::~Value((Value *)&ddf.field_0x260);
      std::__cxx11::string::~string((string *)local_9d8);
      __gnu_cxx::
      __normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<cmScanDepInfo_*,_std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>_>
    ::operator++(&__end1_2);
  }
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)&locs.BmiLocationForModule._M_invoker,
             (string *)snapshot.Position.Position,false,None);
  std::operator<<((ostream *)&locs.BmiLocationForModule._M_invoker,"ninja_dyndep_version = 1.0\n");
  CxxModuleLocations::CxxModuleLocations((CxxModuleLocations *)local_da8);
  std::__cxx11::string::operator=((string *)local_da8,".");
  local_db0.this = this;
  std::function<std::__cxx11::string(std::__cxx11::string)>::operator=
            ((function<std::__cxx11::string(std::__cxx11::string)> *)
             (locs.RootDirectory.field_2._M_local_buf + 8),&local_db0);
  aStack_db8.mod_files =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
        *)&__range1_1;
  std::function<CxxBmiLocation(std::__cxx11::string_const&)>::operator=
            ((function<CxxBmiLocation(std::__cxx11::string_const&)> *)
             &locs.PathForGenerator._M_invoker,&stack0xfffffffffffff248);
  bVar2 = std::optional::operator_cast_to_bool((optional *)&local_8f0);
  if (bVar2) {
    cycle_modules._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
    CxxModuleUsageSeed_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_df0,(CxxModuleLocations *)local_da8,
               (vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *)&__range1,
               (CxxModuleUsage *)&mod_files._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (bool *)((long)&cycle_modules._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    bVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_df0);
    if (bVar2) {
      if ((cycle_modules._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
        usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      }
      else {
        this_local._7_1_ = 0;
        usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
      }
    }
    else {
      sVar21 = (string_view)::cm::operator____s("\", \"",4);
      cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                (&local_e30,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_df0,sVar21);
      build.RspFile.field_2._M_local_buf[0xf] = '\"';
      cmStrCat<char_const(&)[82],std::__cxx11::string,char>
                (&local_e10,
                 (char (*) [82])
                 "Circular dependency detected in the C++ module import graph. See modules named: \""
                 ,&local_e30,build.RspFile.field_2._M_local_buf + 0xf);
      cmSystemTools::Error(&local_e10);
      std::__cxx11::string::~string((string *)&local_e10);
      std::__cxx11::string::~string((string *)&local_e30);
      this_local._7_1_ = 0;
      usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_df0);
    if (usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0)
    goto LAB_0057621f;
  }
  else {
LAB_0057621f:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_fa0,"dyndep",(allocator<char> *)((long)&__range1_3 + 7));
    cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_f80,&local_fa0);
    std::__cxx11::string::~string((string *)&local_fa0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_3 + 7));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[1]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               (build.Rule.field_2._M_local_buf + 8),(char (*) [1])0x106b4c7);
    __end1_3 = std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>::begin
                         ((vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *)&__range1);
    object_1 = (cmScanDepInfo *)
               std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>::end
                         ((vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *)&__range1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1_3,
                              (__normal_iterator<cmScanDepInfo_*,_std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>_>
                               *)&object_1), bVar2) {
      pcVar9 = __gnu_cxx::
               __normal_iterator<cmScanDepInfo_*,_std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>_>
               ::operator*(&__end1_3);
      psVar10 = ConvertToNinjaPath(this,&pcVar9->PrimaryOutput);
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)((long)&build.Rule.field_2 + 8),0);
      std::__cxx11::string::operator=((string *)pvVar11,(string *)psVar10);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&build.Outputs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __end2_1 = std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::begin
                           (&pcVar9->Provides);
      p_1 = (cmSourceReqInfo *)
            std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::end(&pcVar9->Provides);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
                                 *)&p_1), bVar2) {
        implicitOut.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
             ::operator*(&__end2_1);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                                *)&__range1_1,(key_type *)implicitOut.field_2._8_8_);
        psVar10 = ConvertToNinjaPath(this,&pmVar12->BmiPath);
        std::__cxx11::string::string((string *)&__range2_2,(string *)psVar10);
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)((long)&build.Rule.field_2 + 8),0);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&__range2_2,pvVar11);
        if (bVar2) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &build.Outputs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &__range2_2);
        }
        std::__cxx11::string::~string((string *)&__range2_2);
        __gnu_cxx::
        __normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
        ::operator++(&__end2_1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&build.ExplicitDeps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __end2_2 = std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::begin
                           (&pcVar9->Requires);
      r = (cmSourceReqInfo *)
          std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::end(&pcVar9->Requires);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_2,
                                (__normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
                                 *)&r), bVar2) {
        mit._M_node = (_Base_ptr)
                      __gnu_cxx::
                      __normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
                      ::operator*(&__end2_2);
        local_1030._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                     *)&__range1_1,(key_type *)mit._M_node);
        local_1038._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                    *)&__range1_1);
        bVar2 = std::operator!=(&local_1030,&local_1038);
        if (bVar2) {
          ppVar13 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>
                    ::operator->(&local_1030);
          psVar10 = ConvertToNinjaPath(this,&(ppVar13->second).BmiPath);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&build.ExplicitDeps.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar10);
        }
        __gnu_cxx::
        __normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
        ::operator++(&__end2_2);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&build.OrderOnlyDeps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::empty
                        (&pcVar9->Provides);
      if (!bVar2) {
        std::
        map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::emplace<char_const(&)[7],char_const(&)[2]>
                  ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&build.OrderOnlyDeps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [7])"restat",
                   (char (*) [2])0x107dfd8);
      }
      bVar2 = std::optional::operator_cast_to_bool((optional *)&local_8f0);
      if (bVar2) {
        pCVar14 = std::optional<CxxModuleMapFormat>::operator*
                            ((optional<CxxModuleMapFormat> *)&local_8f0);
        CxxModuleMapContent_abi_cxx11_
                  ((string *)&mmf.field_0x260,*pCVar14,(CxxModuleLocations *)local_da8,pcVar9,
                   (CxxModuleUsage *)&mod_files._M_t._M_impl.super__Rb_tree_header._M_node_count);
        cmStrCat<std::__cxx11::string_const&,char_const(&)[8]>
                  ((string *)&target_module_info.limit_,&pcVar9->PrimaryOutput,
                   (char (*) [8])".modmap");
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)local_12d0,(string *)&target_module_info.limit_,false,
                   None);
        std::__cxx11::string::~string((string *)&target_module_info.limit_);
        cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_12d0,true);
        std::operator<<((ostream *)local_12d0,(string *)&mmf.field_0x260);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_12d0);
        std::__cxx11::string::~string((string *)&mmf.field_0x260);
      }
      WriteBuild(this,(ostream *)&locs.BmiLocationForModule._M_invoker,(cmNinjaBuild *)local_f80,0,
                 (bool *)0x0);
      __gnu_cxx::
      __normal_iterator<cmScanDepInfo_*,_std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>_>
      ::operator++(&__end1_3);
    }
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_f80);
    usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  }
  CxxModuleLocations::~CxxModuleLocations((CxxModuleLocations *)local_da8);
  if (usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0) {
    Json::Value::Value((Value *)&target_usages,objectValue);
    pVVar15 = Json::Value::operator[]((Value *)&target_usages,"modules");
    Json::Value::operator=(pVVar15,(Value *)&__range1_2);
    Json::Value::Value((Value *)&__range1_4,objectValue);
    pVVar15 = Json::Value::operator[]((Value *)&target_usages,"usages");
    pVVar15 = Json::Value::operator=(pVVar15,(Value *)&__range1_4);
    Json::Value::~Value((Value *)&__range1_4);
    psVar16 = &mod_files._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_1320 = pVVar15;
    __end1_4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)psVar16);
    u = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)psVar16);
    while (bVar2 = std::operator!=(&__end1_4,(_Self *)&u), bVar2) {
      mod_usage = (Value *)std::
                           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ::operator*(&__end1_4);
      Json::Value::Value((Value *)&__range2_3,arrayValue);
      pVVar15 = Json::Value::operator[](local_1320,(String *)mod_usage);
      pVVar15 = Json::Value::operator=(pVVar15,(Value *)&__range2_3);
      Json::Value::~Value((Value *)&__range2_3);
      this_03 = &mod_usage->limit_;
      local_1370 = pVVar15;
      __end2_3 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this_03);
      v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_03);
      while (bVar2 = std::operator!=(&__end2_3,(_Self *)&v), bVar2) {
        value = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&__end2_3);
        pVVar15 = local_1370;
        Json::Value::Value((Value *)local_13e0,value);
        Json::Value::append(pVVar15,(Value *)local_13e0);
        Json::Value::~Value((Value *)local_13e0);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end2_3);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end1_4);
    }
    Json::Value::Value((Value *)&__range1_5,objectValue);
    pVVar15 = Json::Value::operator[]((Value *)&target_usages,"references");
    pVVar15 = Json::Value::operator=(pVVar15,(Value *)&__range1_5);
    Json::Value::~Value((Value *)&__range1_5);
    psVar16 = &usages.Usage._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_13f0 = pVVar15;
    __end1_5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
                        *)psVar16);
    r_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
                    *)psVar16);
    while( true ) {
      bVar2 = std::operator!=(&__end1_5,(_Self *)&r_1);
      if (!bVar2) break;
      mod_ref = (Value *)std::
                         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>
                         ::operator*(&__end1_5);
      Json::Value::Value(&local_1468,objectValue);
      pVVar15 = Json::Value::operator[](local_13f0,(String *)mod_ref);
      pVVar15 = Json::Value::operator=(pVVar15,&local_1468);
      Json::Value::~Value(&local_1468);
      local_1440 = pVVar15;
      Json::Value::Value(&local_1490,(String *)&mod_ref->limit_);
      pVVar15 = Json::Value::operator[](local_1440,"path");
      Json::Value::operator=(pVVar15,&local_1490);
      Json::Value::~Value(&local_1490);
      sVar21 = (string_view)
               WriteDyndepFile::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)((long)&target_references + 7),
                          (LookupMethod)mod_ref[1].start_);
      local_14e8 = sVar21;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<cm::static_string_view,void>
                ((string *)&local_14d8,(static_string_view *)&local_14e8,
                 (allocator<char> *)(target_mods_file.field_2._M_local_buf + 0xf));
      Json::Value::Value(&local_14b8,&local_14d8);
      pVVar15 = Json::Value::operator[](local_1440,"lookup-method");
      Json::Value::operator=(pVVar15,&local_14b8);
      Json::Value::~Value(&local_14b8);
      std::__cxx11::string::~string((string *)&local_14d8);
      std::allocator<char>::~allocator
                ((allocator<char> *)(target_mods_file.field_2._M_local_buf + 0xf));
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>
      ::operator++(&__end1_5);
    }
    cmsys::SystemTools::GetFilenamePath(&local_1530,(string *)snapshot.Position.Position);
    __range1_6._7_1_ = 0x2f;
    cmStrCat<std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[13]>
              ((string *)local_1510,&local_1530,(char *)((long)&__range1_6 + 7),arg_lang,
               (char (*) [13])"Modules.json");
    std::__cxx11::string::~string((string *)&local_1530);
    __end1_6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(forward_modules_from_target_dirs);
    forward_modules_from_target_dir =
         (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(forward_modules_from_target_dirs);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1_6,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&forward_modules_from_target_dir);
      if (!bVar2) break;
      fmftn.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1_6);
      fmft.limit_._7_1_ = 0x2f;
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char_const(&)[13]>
                ((string *)local_1578,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 fmftn.field_2._8_8_,(char *)((long)&fmft.limit_ + 7),arg_lang,
                 (char (*) [13])"Modules.json");
      Json::Value::Value((Value *)local_15a8,nullValue);
      pcVar17 = (char *)std::__cxx11::string::c_str();
      _Var4 = std::operator|(_S_in,_S_bin);
      std::ifstream::ifstream(local_17b0,pcVar17,_Var4);
      bVar3 = std::ios::operator!((ios *)(local_17b0 +
                                         (long)*(_func_int **)((long)local_17b0 + -0x18)));
      if ((bVar3 & 1) == 0) {
        Json::Reader::Reader((Reader *)local_18e0);
        bVar2 = Json::Reader::parse((Reader *)local_18e0,(istream *)local_17b0,(Value *)local_15a8,
                                    false);
        uVar1 = fmftn.field_2._8_8_;
        if (bVar2) {
          bVar2 = Json::Value::isObject((Value *)local_15a8);
          if (bVar2) {
            pVVar15 = Json::Value::operator[]((Value *)&target_usages,"modules");
            pVVar18 = Json::Value::operator[]((Value *)local_15a8,"modules");
            WriteDyndepFile::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&tmi_target_modules + 7),pVVar15,pVVar18);
            pVVar15 = local_13f0;
            pVVar18 = Json::Value::operator[]((Value *)local_15a8,"references");
            WriteDyndepFile::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&tmi_target_modules + 7),pVVar15,pVVar18);
            pVVar15 = local_1320;
            pVVar18 = Json::Value::operator[]((Value *)local_15a8,"usages");
            WriteDyndepFile::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&tmi_target_modules + 7),pVVar15,pVVar18);
            usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
          }
          else {
            usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0x23;
          }
        }
        else {
          Json::Reader::getFormattedErrorMessages_abi_cxx11_
                    ((String *)local_1920,(Reader *)local_18e0);
          cmStrCat<char_const(&)[39],std::__cxx11::string_const&,std::__cxx11::string>
                    (&local_1900,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1920
                    );
          cmSystemTools::Error(&local_1900);
          std::__cxx11::string::~string((string *)&local_1900);
          std::__cxx11::string::~string((string *)local_1920);
          this_local._7_1_ = 0;
          usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
        }
        Json::Reader::~Reader((Reader *)local_18e0);
      }
      else {
        cmStrCat<char_const(&)[38],std::__cxx11::string_const&,char_const(&)[24]>
                  ((string *)&reader_1.features_,
                   (char (*) [38])"-E cmake_ninja_dyndep failed to open ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1578,
                   (char (*) [24])" for module information");
        cmSystemTools::Error((string *)&reader_1.features_);
        std::__cxx11::string::~string((string *)&reader_1.features_);
        this_local._7_1_ = 0;
        usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
      }
      std::ifstream::~ifstream(local_17b0);
      Json::Value::~Value((Value *)local_15a8);
      std::__cxx11::string::~string((string *)local_1578);
      if ((usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 0) &&
         (usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 0x23))
      goto LAB_0057748a;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_6);
    }
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&cb.ModuleFile._M_invoker,(string *)local_1510,false,None);
    cmGeneratedFileStream::SetCopyIfDifferent
              ((cmGeneratedFileStream *)&cb.ModuleFile._M_invoker,true);
    Json::operator<<((OStream *)&cb.ModuleFile._M_invoker,(Value *)&target_usages);
    cmDyndepMetadataCallbacks::cmDyndepMetadataCallbacks((cmDyndepMetadataCallbacks *)local_1bb8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
    ::map(&local_1be8,
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
           *)&__range1_1);
    std::function<std::optional<std::__cxx11::string>(std::__cxx11::string_const&)>::operator=
              ((function<std::optional<std::__cxx11::string>(std::__cxx11::string_const&)> *)
               local_1bb8,(anon_class_48_1_9338819a *)&local_1be8);
    WriteDyndepFile(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmCxxModuleExportInfo_const&)
    ::$_2::~__2((__2 *)&local_1be8);
    this_local._7_1_ =
         cmDyndepCollation::WriteDyndepMetadata
                   (arg_lang,(vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *)&__range1,
                    export_info,(cmDyndepMetadataCallbacks *)local_1bb8);
    usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
    cmDyndepMetadataCallbacks::~cmDyndepMetadataCallbacks((cmDyndepMetadataCallbacks *)local_1bb8);
    cmGeneratedFileStream::~cmGeneratedFileStream
              ((cmGeneratedFileStream *)&cb.ModuleFile._M_invoker);
LAB_0057748a:
    std::__cxx11::string::~string((string *)local_1510);
    Json::Value::~Value((Value *)&target_usages);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream
            ((cmGeneratedFileStream *)&locs.BmiLocationForModule._M_invoker);
  Json::Value::~Value((Value *)&__range1_2);
LAB_005774f2:
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
          *)&__range1_1);
  CxxModuleUsage::~CxxModuleUsage
            ((CxxModuleUsage *)&mod_files._M_t._M_impl.super__Rb_tree_header._M_node_count);
LAB_00577526:
  std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>::~vector
            ((vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *)&__range1);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGlobalNinjaGenerator::WriteDyndepFile(
  std::string const& dir_top_src, std::string const& dir_top_bld,
  std::string const& dir_cur_src, std::string const& dir_cur_bld,
  std::string const& arg_dd, std::vector<std::string> const& arg_ddis,
  std::string const& module_dir,
  std::vector<std::string> const& linked_target_dirs,
  std::vector<std::string> const& forward_modules_from_target_dirs,
  std::string const& arg_lang, std::string const& arg_modmapfmt,
  cmCxxModuleExportInfo const& export_info)
{
  // Setup path conversions.
  {
    cmStateSnapshot snapshot = this->GetCMakeInstance()->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentSource(dir_cur_src);
    snapshot.GetDirectory().SetCurrentBinary(dir_cur_bld);
    auto mfd = cm::make_unique<cmMakefile>(this, snapshot);
    auto lgd = this->CreateLocalGenerator(mfd.get());
    lgd->SetRelativePathTop(dir_top_src, dir_top_bld);
    this->Makefiles.push_back(std::move(mfd));
    this->LocalGenerators.push_back(std::move(lgd));
  }

  std::vector<cmScanDepInfo> objects;
  for (std::string const& arg_ddi : arg_ddis) {
    cmScanDepInfo info;
    if (!cmScanDepFormat_P1689_Parse(arg_ddi, &info)) {
      cmSystemTools::Error(
        cmStrCat("-E cmake_ninja_dyndep failed to parse ddi file ", arg_ddi));
      return false;
    }
    objects.push_back(std::move(info));
  }

  CxxModuleUsage usages;

  // Map from module name to module file path, if known.
  struct AvailableModuleInfo
  {
    std::string BmiPath;
    bool IsPrivate;
  };
  std::map<std::string, AvailableModuleInfo> mod_files;

  // Populate the module map with those provided by linked targets first.
  for (std::string const& linked_target_dir : linked_target_dirs) {
    std::string const ltmn =
      cmStrCat(linked_target_dir, '/', arg_lang, "Modules.json");
    Json::Value ltm;
    cmsys::ifstream ltmf(ltmn.c_str(), std::ios::in | std::ios::binary);
    if (!ltmf) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to open ",
                                    ltmn, " for module information"));
      return false;
    }
    Json::Reader reader;
    if (!reader.parse(ltmf, ltm, false)) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    linked_target_dir,
                                    reader.getFormattedErrorMessages()));
      return false;
    }
    if (ltm.isObject()) {
      Json::Value const& target_modules = ltm["modules"];
      if (target_modules.isObject()) {
        for (auto i = target_modules.begin(); i != target_modules.end(); ++i) {
          Json::Value const& visible_module = *i;
          if (visible_module.isObject()) {
            Json::Value const& bmi_path = visible_module["bmi"];
            Json::Value const& is_private = visible_module["is-private"];
            mod_files[i.key().asString()] = AvailableModuleInfo{
              bmi_path.asString(),
              is_private.asBool(),
            };
          }
        }
      }
      Json::Value const& target_modules_references = ltm["references"];
      if (target_modules_references.isObject()) {
        for (auto i = target_modules_references.begin();
             i != target_modules_references.end(); ++i) {
          if (i->isObject()) {
            Json::Value const& reference_path = (*i)["path"];
            CxxModuleReference module_reference;
            if (reference_path.isString()) {
              module_reference.Path = reference_path.asString();
            }
            Json::Value const& reference_method = (*i)["lookup-method"];
            if (reference_method.isString()) {
              std::string reference = reference_method.asString();
              if (reference == "by-name") {
                module_reference.Method = LookupMethod::ByName;
              } else if (reference == "include-angle") {
                module_reference.Method = LookupMethod::IncludeAngle;
              } else if (reference == "include-quote") {
                module_reference.Method = LookupMethod::IncludeQuote;
              }
            }
            usages.Reference[i.key().asString()] = module_reference;
          }
        }
      }
      Json::Value const& target_modules_usage = ltm["usages"];
      if (target_modules_usage.isObject()) {
        for (auto i = target_modules_usage.begin();
             i != target_modules_usage.end(); ++i) {
          if (i->isArray()) {
            for (auto j = i->begin(); j != i->end(); ++j) {
              usages.Usage[i.key().asString()].insert(j->asString());
            }
          }
        }
      }
    }
  }

  cm::optional<CxxModuleMapFormat> modmap_fmt;
  if (arg_modmapfmt.empty()) {
    // nothing to do.
  } else if (arg_modmapfmt == "clang") {
    modmap_fmt = CxxModuleMapFormat::Clang;
  } else if (arg_modmapfmt == "gcc") {
    modmap_fmt = CxxModuleMapFormat::Gcc;
  } else if (arg_modmapfmt == "msvc") {
    modmap_fmt = CxxModuleMapFormat::Msvc;
  } else {
    cmSystemTools::Error(
      cmStrCat("-E cmake_ninja_dyndep does not understand the ", arg_modmapfmt,
               " module map format"));
    return false;
  }

  auto module_ext = CxxModuleMapExtension(modmap_fmt);

  // Extend the module map with those provided by this target.
  // We do this after loading the modules provided by linked targets
  // in case we have one of the same name that must be preferred.
  Json::Value target_modules = Json::objectValue;
  for (cmScanDepInfo const& object : objects) {
    for (auto const& p : object.Provides) {
      std::string mod;
      if (cmDyndepCollation::IsBmiOnly(export_info, object.PrimaryOutput)) {
        mod = object.PrimaryOutput;
      } else if (!p.CompiledModulePath.empty()) {
        // The scanner provided the path to the module file.
        mod = p.CompiledModulePath;
        if (!cmSystemTools::FileIsFullPath(mod)) {
          // Treat relative to work directory (top of build tree).
          mod = cmSystemTools::CollapseFullPath(mod, dir_top_bld);
        }
      } else {
        // Assume the module file path matches the logical module name.
        std::string safe_logical_name =
          p.LogicalName; // TODO: needs fixing for header units
        cmSystemTools::ReplaceString(safe_logical_name, ":", "-");
        mod = cmStrCat(module_dir, safe_logical_name, module_ext);
      }
      mod_files[p.LogicalName] = AvailableModuleInfo{
        mod,
        false, // Always visible within our own target.
      };
      Json::Value& module_info = target_modules[p.LogicalName] =
        Json::objectValue;
      module_info["bmi"] = mod;
      module_info["is-private"] =
        cmDyndepCollation::IsObjectPrivate(object.PrimaryOutput, export_info);
    }
  }

  cmGeneratedFileStream ddf(arg_dd);
  ddf << "ninja_dyndep_version = 1.0\n";

  {
    CxxModuleLocations locs;
    locs.RootDirectory = ".";
    locs.PathForGenerator = [this](std::string path) -> std::string {
      path = this->ConvertToNinjaPath(path);
#  ifdef _WIN32
      if (this->IsGCCOnWindows()) {
        std::replace(path.begin(), path.end(), '\\', '/');
      }
#  endif
      return path;
    };
    locs.BmiLocationForModule =
      [&mod_files](std::string const& logical) -> CxxBmiLocation {
      auto m = mod_files.find(logical);
      if (m != mod_files.end()) {
        if (m->second.IsPrivate) {
          return CxxBmiLocation::Private();
        }
        return CxxBmiLocation::Known(m->second.BmiPath);
      }
      return CxxBmiLocation::Unknown();
    };

    // Insert information about the current target's modules.
    if (modmap_fmt) {
      bool private_usage_found = false;
      auto cycle_modules =
        CxxModuleUsageSeed(locs, objects, usages, private_usage_found);
      if (!cycle_modules.empty()) {
        cmSystemTools::Error(
          cmStrCat("Circular dependency detected in the C++ module import "
                   "graph. See modules named: \"",
                   cmJoin(cycle_modules, R"(", ")"_s), '"'));
        return false;
      }
      if (private_usage_found) {
        // Already errored in the function.
        return false;
      }
    }

    cmNinjaBuild build("dyndep");
    build.Outputs.emplace_back("");
    for (cmScanDepInfo const& object : objects) {
      build.Outputs[0] = this->ConvertToNinjaPath(object.PrimaryOutput);
      build.ImplicitOuts.clear();
      for (auto const& p : object.Provides) {
        auto const implicitOut =
          this->ConvertToNinjaPath(mod_files[p.LogicalName].BmiPath);
        // Ignore the `provides` when the BMI is the output.
        if (implicitOut != build.Outputs[0]) {
          build.ImplicitOuts.emplace_back(implicitOut);
        }
      }
      build.ImplicitDeps.clear();
      for (auto const& r : object.Requires) {
        auto mit = mod_files.find(r.LogicalName);
        if (mit != mod_files.end()) {
          build.ImplicitDeps.push_back(
            this->ConvertToNinjaPath(mit->second.BmiPath));
        }
      }
      build.Variables.clear();
      if (!object.Provides.empty()) {
        build.Variables.emplace("restat", "1");
      }

      if (modmap_fmt) {
        auto mm = CxxModuleMapContent(*modmap_fmt, locs, object, usages);

        // XXX(modmap): If changing this path construction, change
        // `cmNinjaTargetGenerator::WriteObjectBuildStatements` and
        // `cmNinjaTargetGenerator::ExportObjectCompileCommand` to generate the
        // corresponding file path.
        cmGeneratedFileStream mmf(cmStrCat(object.PrimaryOutput, ".modmap"));
        mmf.SetCopyIfDifferent(true);
        mmf << mm;
      }

      this->WriteBuild(ddf, build);
    }
  }

  Json::Value target_module_info = Json::objectValue;
  target_module_info["modules"] = target_modules;

  auto& target_usages = target_module_info["usages"] = Json::objectValue;
  for (auto const& u : usages.Usage) {
    auto& mod_usage = target_usages[u.first] = Json::arrayValue;
    for (auto const& v : u.second) {
      mod_usage.append(v);
    }
  }

  auto name_for_method = [](LookupMethod method) -> cm::static_string_view {
    switch (method) {
      case LookupMethod::ByName:
        return "by-name"_s;
      case LookupMethod::IncludeAngle:
        return "include-angle"_s;
      case LookupMethod::IncludeQuote:
        return "include-quote"_s;
    }
    assert(false && "unsupported lookup method");
    return ""_s;
  };

  auto& target_references = target_module_info["references"] =
    Json::objectValue;
  for (auto const& r : usages.Reference) {
    auto& mod_ref = target_references[r.first] = Json::objectValue;
    mod_ref["path"] = r.second.Path;
    mod_ref["lookup-method"] = std::string(name_for_method(r.second.Method));
  }

  // Store the map of modules provided by this target in a file for
  // use by dependents that reference this target in linked-target-dirs.
  std::string const target_mods_file = cmStrCat(
    cmSystemTools::GetFilenamePath(arg_dd), '/', arg_lang, "Modules.json");

  // Populate the module map with those provided by linked targets first.
  for (std::string const& forward_modules_from_target_dir :
       forward_modules_from_target_dirs) {
    std::string const fmftn =
      cmStrCat(forward_modules_from_target_dir, '/', arg_lang, "Modules.json");
    Json::Value fmft;
    cmsys::ifstream fmftf(fmftn.c_str(), std::ios::in | std::ios::binary);
    if (!fmftf) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to open ",
                                    fmftn, " for module information"));
      return false;
    }
    Json::Reader reader;
    if (!reader.parse(fmftf, fmft, false)) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    forward_modules_from_target_dir,
                                    reader.getFormattedErrorMessages()));
      return false;
    }
    if (!fmft.isObject()) {
      continue;
    }

    auto forward_info = [](Json::Value& target, Json::Value const& source) {
      if (!source.isObject()) {
        return;
      }

      for (auto i = source.begin(); i != source.end(); ++i) {
        std::string const key = i.key().asString();
        if (target.isMember(key)) {
          continue;
        }
        target[key] = *i;
      }
    };

    // Forward info from forwarding targets into our collation.
    Json::Value& tmi_target_modules = target_module_info["modules"];
    forward_info(tmi_target_modules, fmft["modules"]);
    forward_info(target_references, fmft["references"]);
    forward_info(target_usages, fmft["usages"]);
  }

  cmGeneratedFileStream tmf(target_mods_file);
  tmf.SetCopyIfDifferent(true);
  tmf << target_module_info;

  cmDyndepMetadataCallbacks cb;
  cb.ModuleFile =
    [mod_files](std::string const& name) -> cm::optional<std::string> {
    auto m = mod_files.find(name);
    if (m != mod_files.end()) {
      return m->second.BmiPath;
    }
    return {};
  };

  return cmDyndepCollation::WriteDyndepMetadata(arg_lang, objects, export_info,
                                                cb);
}